

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O3

void parseUUID(char *uuid,uchar *buffer_out,uint out_size)

{
  char cVar1;
  int iVar2;
  size_t __size;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  uchar cur_character;
  byte local_39;
  uchar *local_38;
  
  __size = strlen(uuid);
  __ptr = calloc(1,__size);
  buffer_out[0] = '\0';
  buffer_out[1] = '\0';
  buffer_out[2] = '\0';
  buffer_out[3] = '\0';
  buffer_out[4] = '\0';
  buffer_out[5] = '\0';
  buffer_out[6] = '\0';
  buffer_out[7] = '\0';
  if (__size != 0) {
    uVar4 = 0;
    uVar3 = 0;
    local_38 = buffer_out;
    do {
      cVar1 = uuid[uVar4];
      iVar2 = isxdigit((int)cVar1);
      if (iVar2 != 0) {
        *(char *)((long)__ptr + uVar3) = cVar1;
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < __size);
    uVar4 = uVar3;
    if ((uVar3 & 1) != 0) {
      uVar4 = (ulong)((int)uVar3 + 1);
      *(undefined1 *)((long)__ptr + uVar3) = 0x30;
    }
    *(undefined1 *)((long)__ptr + uVar4) = 0;
    if (1 < (uint)uVar4) {
      uVar3 = 0;
      pvVar5 = __ptr;
      do {
        __isoc99_sscanf(pvVar5,"%2hhx",&local_39);
        local_38[(uint)uVar3 & 7] = local_38[(uint)uVar3 & 7] ^ local_39;
        uVar3 = uVar3 + 1;
        pvVar5 = (void *)((long)pvVar5 + 2);
      } while ((uint)uVar4 >> 1 != uVar3);
    }
  }
  free(__ptr);
  return;
}

Assistant:

static void parseUUID(const char *uuid, unsigned char *buffer_out, unsigned int out_size) {
	unsigned int i, j;
	char *hexuuid;
	unsigned char cur_character;
	// remove characters not in hex set
	size_t len = strlen(uuid);
	hexuuid = (char *)malloc(sizeof(char) * len);
	memset(buffer_out, 0, out_size);
	memset(hexuuid, 0, sizeof(char) * len);

	for (i = 0, j = 0; i < len; i++) {
		if (isxdigit(uuid[i])) {
			hexuuid[j] = uuid[i];
			j++;
		} else {
			// skip
			continue;
		}
	}
	if (j % 2 == 1) {
		hexuuid[j++] = '0';
	}
	hexuuid[j] = '\0';
	for (i = 0; i < j / 2; i++) {
		sscanf(&hexuuid[i * 2], "%2hhx", &cur_character);
		buffer_out[i % out_size] = buffer_out[i % out_size] ^ cur_character;
	}

	free(hexuuid);
}